

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O2

SourceRange __thiscall slang::syntax::SyntaxNode::sourceRange(SyntaxNode *this)

{
  SourceLocation SVar1;
  string_view sVar2;
  SourceRange SVar3;
  Token lastToken;
  Token firstToken;
  Token local_38;
  Token local_28;
  
  local_28 = getFirstToken(this);
  local_38 = getLastToken(this);
  SVar3.startLoc = parsing::Token::location(&local_28);
  SVar1 = parsing::Token::location(&local_38);
  sVar2 = parsing::Token::rawText(&local_38);
  SVar3.endLoc = (SourceLocation)((long)SVar1 + sVar2._M_len * 0x10000000);
  return SVar3;
}

Assistant:

SourceRange SyntaxNode::sourceRange() const {
    Token firstToken = getFirstToken();
    Token lastToken = getLastToken();
    return SourceRange(firstToken.location(), lastToken.location() + lastToken.rawText().length());
}